

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_array.cpp
# Opt level: O3

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseArray(Parser *this)

{
  Token *pTVar1;
  Token *pTVar2;
  Token *pTVar3;
  size_t sVar4;
  Lexer *pLVar5;
  __uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> _Var6;
  long lVar7;
  size_t sVar8;
  undefined8 uVar9;
  bool bVar10;
  Lexer *this_00;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  ArrayLitExpr *this_01;
  ArrayEmptyExpr *this_02;
  Parser *in_RSI;
  pointer __p;
  initializer_list<pfederc::Position> __l;
  initializer_list<pfederc::Position> __l_00;
  initializer_list<pfederc::Position> __l_01;
  Position pos;
  list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  exprs;
  undefined1 local_e8 [16];
  Position local_d8;
  Position local_b8;
  Position local_98;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_78;
  Error<pfederc::SyntaxErrorCode> *local_70;
  Position local_68;
  undefined1 local_48 [16];
  
  pTVar1 = in_RSI->lexer->currentToken;
  sanityExpect(in_RSI,TOK_OP_ARR_BRACKET_OPEN);
  parseExpression((Parser *)local_e8,(Precedence)in_RSI);
  if ((_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_e8._0_8_ ==
      (Expr *)0x0) {
    this->lexer = (Lexer *)0x0;
    return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
           (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
  }
  bVar10 = expect(in_RSI,TOK_STMT);
  if (bVar10) {
    parseExpression((Parser *)&local_68,(Precedence)in_RSI);
    if ((Lexer *)local_68.line == (Lexer *)0x0) {
      this->lexer = (Lexer *)0x0;
    }
    else {
      pTVar2 = in_RSI->lexer->currentToken;
      bVar10 = expect(in_RSI,TOK_ARR_BRACKET_CLOSE);
      if (!bVar10) {
        pTVar3 = in_RSI->lexer->currentToken;
        local_98.line = (pTVar1->pos).line;
        local_98.startIndex = (pTVar1->pos).startIndex;
        local_98.endIndex = (pTVar1->pos).endIndex;
        __l._M_len = 1;
        __l._M_array = &local_98;
        std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
                  ((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)&local_d8,__l,
                   (allocator_type *)&local_70);
        local_b8.line = (size_t)operator_new(0x38);
        sVar4 = (pTVar3->pos).endIndex;
        ((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->logLevel = LVL_ERROR;
        ((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->err =
             STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
        sVar8 = (pTVar3->pos).startIndex;
        (((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->pos).line = (pTVar3->pos).line;
        (((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->pos).startIndex = sVar8;
        (((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->pos).endIndex = sVar4;
        (((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_d8.line;
        (((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_d8.startIndex;
        (((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_d8.endIndex;
        local_d8.line = 0;
        local_d8.startIndex = 0;
        local_d8.endIndex = 0;
        generateError((Parser *)&stack0xffffffffffffffc8,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)in_RSI);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   &stack0xffffffffffffffc8);
        if ((Error<pfederc::SyntaxErrorCode> *)local_b8.line !=
            (Error<pfederc::SyntaxErrorCode> *)0x0) {
          std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                    ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_b8,
                     (Error<pfederc::SyntaxErrorCode> *)local_b8.line);
        }
        local_b8.line = 0;
        if ((_Base_ptr)local_d8.line != (_Base_ptr)0x0) {
          operator_delete((void *)local_d8.line,local_d8.endIndex - local_d8.line);
        }
      }
      Position::operator+(&pTVar1->pos,(Position *)(local_e8._0_8_ + 0x20));
      Position::operator+(&local_b8,
                          (Position *)&((string *)(local_68.line + 0x18))->_M_string_length);
      Position::operator+(&local_98,&pTVar2->pos);
      pLVar5 = in_RSI->lexer;
      this_00 = (Lexer *)operator_new(0x48);
      ArrayCpyExpr::ArrayCpyExpr
                ((ArrayCpyExpr *)this_00,pLVar5,&local_d8,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_e8,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_68);
      local_98.line = 0;
      this->lexer = this_00;
      std::unique_ptr<pfederc::ArrayCpyExpr,_std::default_delete<pfederc::ArrayCpyExpr>_>::
      ~unique_ptr((unique_ptr<pfederc::ArrayCpyExpr,_std::default_delete<pfederc::ArrayCpyExpr>_> *)
                  &local_98);
      if ((Lexer *)local_68.line != (Lexer *)0x0) {
        (*(*(_func_int ***)local_68.line)[1])();
      }
    }
  }
  else {
    local_78._M_head_impl = (Expr *)this;
    if (*(int *)&(((string *)(local_e8._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12) {
      if (*(_List_node_base **)local_e8._0_8_ != (_List_node_base *)&PTR__BiOpExpr_0012b990) {
        __cxa_bad_cast();
      }
      if (*(short *)&((Expr *)(local_e8._0_8_ + 0x38))->parent == 0x2e) {
        local_d8.line = ((Position *)(local_e8._0_8_ + 0x20))->line;
        local_d8.startIndex =
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&((Position *)(local_e8._0_8_ + 0x20))->startIndex)->_M_allocated_capacity;
        local_d8.endIndex = ((Position *)(local_e8._0_8_ + 0x20))->endIndex;
        local_98.line = (size_t)&local_98;
        local_98.endIndex = 0;
        local_98.startIndex = local_98.line;
        do {
          uVar9 = local_e8._0_8_;
          if (*(undefined ***)local_e8._0_8_ != &PTR__BiOpExpr_0012b990) {
            __cxa_bad_cast();
          }
          if (*(short *)&((_List_node_base *)(local_e8._0_8_ + 0x40))->_M_next != 0x2e) break;
          p_Var12 = ((_List_node_base *)(local_e8._0_8_ + 0x50))->_M_next;
          ((_List_node_base *)(local_e8._0_8_ + 0x50))->_M_next = (_List_node_base *)0x0;
          p_Var11 = (_List_node_base *)operator_new(0x18);
          p_Var11[1]._M_next = p_Var12;
          std::__detail::_List_node_base::_M_hook(p_Var11);
          local_98.endIndex = local_98.endIndex + 1;
          _Var6.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
          super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
               *(__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                (uVar9 + 0x48);
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(uVar9 + 0x48))->_M_allocated_capacity = 0;
          if ((__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)local_e8._0_8_ !=
              (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0) {
            lVar7 = *(long *)local_e8._0_8_;
            local_e8._0_8_ =
                 _Var6.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                 _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
            (**(code **)(lVar7 + 8))();
            _Var6.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
                 (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
                 (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)local_e8._0_8_
            ;
          }
          local_e8._0_8_ =
               _Var6.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
               super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
               super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
        } while (*(int *)&(((string *)(local_e8._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12);
        p_Var12 = (_List_node_base *)operator_new(0x18);
        p_Var12[1]._M_next = (_List_node_base *)local_e8._0_8_;
        local_e8._0_8_ = (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var12);
        local_98.endIndex = local_98.endIndex + 1;
        pTVar2 = in_RSI->lexer->currentToken;
        bVar10 = expect(in_RSI,TOK_ARR_BRACKET_CLOSE);
        if (!bVar10) {
          pTVar3 = in_RSI->lexer->currentToken;
          local_68.line = (pTVar1->pos).line;
          local_68.startIndex = (pTVar1->pos).startIndex;
          local_68.endIndex = (pTVar1->pos).endIndex;
          __l_00._M_len = 1;
          __l_00._M_array = &local_68;
          std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
                    ((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)&local_b8,
                     __l_00,(allocator_type *)(local_e8 + 0xf));
          local_70 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
          sVar4 = (pTVar3->pos).endIndex;
          local_70->logLevel = LVL_ERROR;
          local_70->err = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
          sVar8 = (pTVar3->pos).startIndex;
          (local_70->pos).line = (pTVar3->pos).line;
          (local_70->pos).startIndex = sVar8;
          (local_70->pos).endIndex = sVar4;
          (local_70->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_b8.line;
          (local_70->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_b8.startIndex;
          (local_70->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_b8.endIndex;
          local_b8.line = 0;
          local_b8.startIndex = 0;
          local_b8.endIndex = 0;
          generateError((Parser *)(local_48 + 8),
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)in_RSI);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     (local_48 + 8));
          if (local_70 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
            std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                      ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_70,
                       local_70);
          }
          local_70 = (Error<pfederc::SyntaxErrorCode> *)0x0;
          if ((_Base_ptr)local_b8.line != (_Base_ptr)0x0) {
            operator_delete((void *)local_b8.line,local_b8.endIndex - local_b8.line);
          }
        }
        Position::operator+(&local_d8,&pTVar1->pos);
        Position::operator+(&local_68,&pTVar2->pos);
        this = (Parser *)local_78._M_head_impl;
        local_d8.endIndex = local_b8.endIndex;
        local_d8.line = local_b8.line;
        local_d8.startIndex = local_b8.startIndex;
        pLVar5 = in_RSI->lexer;
        this_01 = (ArrayLitExpr *)operator_new(0x50);
        ArrayLitExpr::ArrayLitExpr
                  (this_01,pLVar5,&local_d8,
                   (list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)&local_98);
        local_b8.line = 0;
        *(ArrayLitExpr **)this = this_01;
        std::unique_ptr<pfederc::ArrayLitExpr,_std::default_delete<pfederc::ArrayLitExpr>_>::
        ~unique_ptr((unique_ptr<pfederc::ArrayLitExpr,_std::default_delete<pfederc::ArrayLitExpr>_>
                     *)&local_b8);
        std::__cxx11::
        _List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ::_M_clear((_List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)&local_98);
        goto LAB_00111412;
      }
    }
    pTVar2 = in_RSI->lexer->currentToken;
    bVar10 = expect(in_RSI,TOK_ARR_BRACKET_CLOSE);
    if (!bVar10) {
      pTVar3 = in_RSI->lexer->currentToken;
      local_98.line = (pTVar1->pos).line;
      local_98.startIndex = (pTVar1->pos).startIndex;
      local_98.endIndex = (pTVar1->pos).endIndex;
      __l_01._M_len = 1;
      __l_01._M_array = &local_98;
      std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
                ((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)&local_d8,__l_01,
                 (allocator_type *)&local_68);
      local_b8.line = (size_t)operator_new(0x38);
      sVar4 = (pTVar3->pos).endIndex;
      ((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->logLevel = LVL_ERROR;
      ((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->err = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET
      ;
      sVar8 = (pTVar3->pos).startIndex;
      (((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->pos).line = (pTVar3->pos).line;
      (((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->pos).startIndex = sVar8;
      (((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->pos).endIndex = sVar4;
      (((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->extraPos).
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_d8.line;
      (((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->extraPos).
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_d8.startIndex;
      (((Error<pfederc::SyntaxErrorCode> *)local_b8.line)->extraPos).
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_d8.endIndex;
      local_d8.line = 0;
      local_d8.startIndex = 0;
      local_d8.endIndex = 0;
      generateError((Parser *)local_48,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_48);
      if ((Error<pfederc::SyntaxErrorCode> *)local_b8.line != (Error<pfederc::SyntaxErrorCode> *)0x0
         ) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_b8,
                   (Error<pfederc::SyntaxErrorCode> *)local_b8.line);
      }
      local_b8.line = 0;
      if ((_Base_ptr)local_d8.line != (_Base_ptr)0x0) {
        operator_delete((void *)local_d8.line,local_d8.endIndex - local_d8.line);
      }
    }
    this = (Parser *)local_78._M_head_impl;
    Position::operator+(&pTVar1->pos,(Position *)(local_e8._0_8_ + 0x20));
    Position::operator+(&local_98,&pTVar2->pos);
    pLVar5 = in_RSI->lexer;
    this_02 = (ArrayEmptyExpr *)operator_new(0x40);
    ArrayEmptyExpr::ArrayEmptyExpr
              (this_02,pLVar5,&local_d8,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_e8);
    local_98.line = 0;
    *(ArrayEmptyExpr **)this = this_02;
    std::unique_ptr<pfederc::ArrayEmptyExpr,_std::default_delete<pfederc::ArrayEmptyExpr>_>::
    ~unique_ptr((unique_ptr<pfederc::ArrayEmptyExpr,_std::default_delete<pfederc::ArrayEmptyExpr>_>
                 *)&local_98);
  }
LAB_00111412:
  if ((_Head_base<0UL,_pfederc::Expr_*,_false>)local_e8._0_8_ !=
      (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
    (*(code *)(*(_List_node_base **)local_e8._0_8_)->_M_prev)();
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseArray() noexcept {
  const Token *const startToken = lexer.getCurrentToken();
  sanityExpect(TokenType::TOK_OP_ARR_BRACKET_OPEN);

  std::unique_ptr<Expr> expr0(parseExpression());
  if (!expr0)
    return nullptr;

  if (expect(TokenType::TOK_STMT)) {
    std::unique_ptr<Expr> expr1(parseExpression());
    if (!expr1)
      return nullptr;

    const Token *const endToken = lexer.getCurrentToken();
    if (!expect(TokenType::TOK_ARR_BRACKET_CLOSE)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_ARR_CLOSING_BRACKET,
        lexer.getCurrentToken()->getPosition(),
        std::vector<Position> { startToken->getPosition() }));
    }

    const Position pos(startToken->getPosition() +
      expr0->getPosition() + expr1->getPosition() + endToken->getPosition());

    return std::make_unique<ArrayCpyExpr>(lexer, pos,
      std::move(expr0), std::move(expr1));
  }
  // now it's either an ArrayEmptyExpr or ArrayLitExpr
  if (isBiOpExpr(*expr0, TokenType::TOK_OP_COMMA)) {
    Position pos(expr0->getPosition());

    std::list<std::unique_ptr<Expr>> exprs;
    while (isBiOpExpr(*expr0, TokenType::TOK_OP_COMMA)) {
      BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr0);
      exprs.insert(exprs.begin(), biopexpr.getRightPtr());
      expr0 = biopexpr.getLeftPtr();
    }

    exprs.insert(exprs.begin(), std::move(expr0));

    const Token *const endToken = lexer.getCurrentToken();
    if (!expect(TokenType::TOK_ARR_BRACKET_CLOSE)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_ARR_CLOSING_BRACKET,
        lexer.getCurrentToken()->getPosition(),
        std::vector<Position> { startToken->getPosition() }));
    }

    pos = pos + startToken->getPosition() + endToken->getPosition();

    return std::make_unique<ArrayLitExpr>(lexer, pos, std::move(exprs));
  }

  const Token *const endToken = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ARR_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_ARR_CLOSING_BRACKET,
      lexer.getCurrentToken()->getPosition(),
      std::vector<Position> { startToken->getPosition() }));
  }

  const Position pos(startToken->getPosition() +
    expr0->getPosition() + endToken->getPosition());

  return std::make_unique<ArrayEmptyExpr>(lexer, pos,
    std::move(expr0));
}